

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_mix_pcm_frames_f32
                    (float *pDst,float *pSrc,ma_uint64 frameCount,ma_uint32 channels,float volume)

{
  long lVar1;
  
  if (channels != 0 && (pSrc != (float *)0x0 && pDst != (float *)0x0)) {
    if ((volume != 0.0) || (NAN(volume))) {
      lVar1 = 0;
      if ((volume != 1.0) || (NAN(volume))) {
        for (; channels * frameCount - lVar1 != 0; lVar1 = lVar1 + 1) {
          pDst[lVar1] = pSrc[lVar1] * volume + pDst[lVar1];
        }
      }
      else {
        for (; channels * frameCount - lVar1 != 0; lVar1 = lVar1 + 1) {
          pDst[lVar1] = pSrc[lVar1] + pDst[lVar1];
        }
      }
    }
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_mix_pcm_frames_f32(float* pDst, const float* pSrc, ma_uint64 frameCount, ma_uint32 channels, float volume)
{
    ma_uint64 iSample;
    ma_uint64 sampleCount;

    if (pDst == NULL || pSrc == NULL || channels == 0) {
        return MA_INVALID_ARGS;
    }

    if (volume == 0) {
        return MA_SUCCESS;  /* No changes if the volume is 0. */
    }

    sampleCount = frameCount * channels;

    if (volume == 1) {
        for (iSample = 0; iSample < sampleCount; iSample += 1) {
            pDst[iSample] += pSrc[iSample];
        }
    } else {
        for (iSample = 0; iSample < sampleCount; iSample += 1) {
            pDst[iSample] += ma_apply_volume_unclipped_f32(pSrc[iSample], volume);
        }
    }

    return MA_SUCCESS;
}